

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMatrix3x3.h
# Opt level: O3

cbtMatrix3x3 * cbtMatrix3x3::getIdentity(void)

{
  if (getIdentity()::identityMatrix == '\0') {
    getIdentity();
  }
  return &getIdentity::identityMatrix;
}

Assistant:

static const cbtMatrix3x3& getIdentity()
	{
#if (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)) || defined(BT_USE_NEON)
		static const cbtMatrix3x3
			identityMatrix(v1000, v0100, v0010);
#else
		static const cbtMatrix3x3
			identityMatrix(
				cbtScalar(1.0), cbtScalar(0.0), cbtScalar(0.0),
				cbtScalar(0.0), cbtScalar(1.0), cbtScalar(0.0),
				cbtScalar(0.0), cbtScalar(0.0), cbtScalar(1.0));
#endif
		return identityMatrix;
	}